

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl_const&>
          (QMovableArrayOps<QUrl> *this,qsizetype i,QUrl *args)

{
  qsizetype *pqVar1;
  QUrl **ppQVar2;
  Data *pDVar3;
  long lVar4;
  QUrl *pQVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QUrl tmp;
  QUrl local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_002fb002:
    local_30.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::QUrl(&local_30,args);
    bVar6 = (this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.size != 0;
    QArrayDataPointer<QUrl>::detachAndGrow
              ((QArrayDataPointer<QUrl> *)this,(uint)(i == 0 && bVar6),1,(QUrl **)0x0,
               (QArrayDataPointer<QUrl> *)0x0);
    pQVar5 = (this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.ptr;
    if (i == 0 && bVar6) {
      pQVar5[-1].d = local_30.d;
      (this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.ptr = pQVar5 + -1;
    }
    else {
      memmove(pQVar5 + i + 1,pQVar5 + i,
              ((this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.size - i) * 8);
      pQVar5[i].d = local_30.d;
    }
    local_30.d = (QUrlPrivate *)0x0;
    pqVar1 = &(this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.size;
    *pqVar1 = *pqVar1 + 1;
    QUrl::~QUrl(&local_30);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
        lVar4)) {
      QUrl::QUrl((this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.ptr + lVar4,args
                );
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QUrl *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.ptr))
      goto LAB_002fb002;
      QUrl::QUrl((this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.ptr + -1,args);
      ppQVar2 = &(this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.ptr;
      *ppQVar2 = *ppQVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }